

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall kj::anon_unknown_9::DiskHandle::exists(DiskHandle *this,PathPtr path)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  Fault f;
  String local_58;
  PathPtr local_40;
  
  local_40.parts.size_ = path.parts.size_;
  local_40.parts.ptr = path.parts.ptr;
  while( true ) {
    iVar2 = (this->fd).fd;
    PathPtr::toString(&local_58,&local_40,false);
    pcVar4 = "";
    if (local_58.content.size_ != 0) {
      pcVar4 = local_58.content.ptr;
    }
    iVar2 = faccessat(iVar2,pcVar4,0,0);
    sVar1 = local_58.content.size_;
    pcVar4 = local_58.content.ptr;
    if (local_58.content.ptr != (char *)0x0) {
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      (**(local_58.content.disposer)->_vptr_ArrayDisposer)
                (local_58.content.disposer,pcVar4,1,sVar1,sVar1,0);
    }
    bVar3 = true;
    if (-1 < iVar2) break;
    iVar2 = _::Debug::getOsErrorNumber(false);
    if (iVar2 != -1) {
      if (iVar2 != 0) {
        if ((iVar2 != 2) && (iVar2 != 0x14)) {
          _::Debug::Fault::Fault<int,kj::PathPtr&>
                    ((Fault *)&local_58,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x2e9,iVar2,"faccessat(fd, path)","path",&local_40);
          _::Debug::Fault::~Fault((Fault *)&local_58);
        }
        bVar3 = false;
      }
      return bVar3;
    }
  }
  return true;
}

Assistant:

bool exists(PathPtr path) const {
    KJ_SYSCALL_HANDLE_ERRORS(faccessat(fd, path.toString().cStr(), F_OK, 0)) {
      case ENOENT:
      case ENOTDIR:
        return false;
      default:
        KJ_FAIL_SYSCALL("faccessat(fd, path)", error, path) { return false; }
    }
    return true;
  }